

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

JsrtExternalObject * __thiscall JsrtExternalObject::Copy(JsrtExternalObject *this,bool deepCopy)

{
  JsrtExternalType *pJVar1;
  JsTraceCallback p_Var2;
  Recycler *pRVar3;
  JsrtExternalObject *pJVar4;
  JsFinalizeCallback p_Var5;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  int local_34;
  JsrtExternalType *pJStack_30;
  int inlineSlotSize;
  JsrtExternalType *type;
  Recycler *recycler;
  JsrtExternalObject *pJStack_18;
  bool deepCopy_local;
  JsrtExternalObject *this_local;
  
  recycler._7_1_ = deepCopy;
  pJStack_18 = this;
  type = (JsrtExternalType *)Js::RecyclableObject::GetRecycler((RecyclableObject *)this);
  pJStack_30 = GetExternalType(this);
  local_34 = GetInlineSlotSize(this);
  p_Var2 = JsrtExternalType::GetJsTraceCallback(pJStack_30);
  pJVar1 = type;
  if (p_Var2 == (JsTraceCallback)0x0) {
    p_Var5 = JsrtExternalType::GetJsFinalizeCallback(pJStack_30);
    pJVar1 = type;
    if (p_Var5 == (JsFinalizeCallback)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_d0,(type_info *)&typeinfo,(long)local_34,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                 ,0xb2);
      pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pJVar1,&local_d0);
      pJVar4 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar3,0x446fd0,0);
      JsrtExternalObject(pJVar4,this,(bool)(recycler._7_1_ & 1));
      this_local = pJVar4;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_98,(type_info *)&typeinfo,(long)local_34,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                 ,0xaf);
      pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pJVar1,&local_98);
      local_a8 = Memory::Recycler::AllocFinalized;
      local_a0 = 0;
      pJVar4 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar3,0x48f150,0);
      JsrtExternalObject(pJVar4,this,(bool)(recycler._7_1_ & 1));
      this_local = pJVar4;
    }
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&typeinfo,(long)local_34,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
               ,0xa9);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pJVar1,&local_60);
    local_70 = Memory::Recycler::AllocTracked;
    local_68 = 0;
    pJVar4 = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar3,0x48f120,0);
    JsrtExternalObject(pJVar4,this,(bool)(recycler._7_1_ & 1));
    this_local = pJVar4;
  }
  return this_local;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Copy(bool deepCopy)
{
    Recycler* recycler = this->GetRecycler();
    JsrtExternalType* type = this->GetExternalType();
    int inlineSlotSize = this->GetInlineSlotSize();

#ifdef _CHAKRACOREBUILD
    if (type->GetJsTraceCallback() != nullptr)
    {
        return RecyclerNewTrackedPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
    }
#endif

    if (type->GetJsFinalizeCallback() != nullptr)
    {
        return RecyclerNewFinalizedPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
    }

    return RecyclerNewPlus(recycler, inlineSlotSize, JsrtExternalObject, this, deepCopy);
}